

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long cb_passthrough_resampler_duplex
               (cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
               long frame_count)

{
  long in_R8;
  closure *c;
  int in_stack_0000006c;
  long in_stack_00000070;
  float *in_stack_00000078;
  float *in_stack_00000080;
  
  check_duplex<float>(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  return in_R8;
}

Assistant:

long cb_passthrough_resampler_duplex(cubeb_stream * /*stm*/, void * user_ptr,
                                     const void * input_buffer,
                                     void * output_buffer, long frame_count)
{
  closure * c = reinterpret_cast<closure*>(user_ptr);
  check_duplex<float>(static_cast<const float*>(input_buffer),
                      static_cast<float*>(output_buffer),
                      frame_count, c->input_channel_count);
  return frame_count;
}